

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

int ON_Material::CompareTextureAttributesAppearance(ON_Material *a,ON_Material *b)

{
  int iVar1;
  ON_Texture *a_00;
  ON_Texture *b_00;
  int local_24;
  int local_20;
  int i;
  int rc;
  int tcount;
  ON_Material *b_local;
  ON_Material *a_local;
  
  iVar1 = ON_ClassArray<ON_Texture>::Count(&(a->m_textures).super_ON_ClassArray<ON_Texture>);
  local_20 = ON_ClassArray<ON_Texture>::Count(&(b->m_textures).super_ON_ClassArray<ON_Texture>);
  local_20 = iVar1 - local_20;
  for (local_24 = 0; local_24 < iVar1 && local_20 == 0; local_24 = local_24 + 1) {
    a_00 = ON_ClassArray<ON_Texture>::operator[]
                     (&(a->m_textures).super_ON_ClassArray<ON_Texture>,local_24);
    b_00 = ON_ClassArray<ON_Texture>::operator[]
                     (&(b->m_textures).super_ON_ClassArray<ON_Texture>,local_24);
    local_20 = ON_Texture::CompareAppearance(a_00,b_00);
  }
  if (local_20 == 0) {
    local_20 = (uint)(a->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture & 1) -
               (uint)(b->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture & 1);
  }
  return local_20;
}

Assistant:

int ON_Material::CompareTextureAttributesAppearance(const ON_Material& a, const ON_Material& b)
{
  // do NOT test index or id

  const int tcount = a.m_textures.Count();
  int rc = tcount - b.m_textures.Count();
  for (int i = 0; i < tcount && 0 == rc; i++)
  {
    rc = ON_Texture::CompareAppearance(a.m_textures[i], b.m_textures[i]);
  }
  if (0 == rc)
    rc = ((int)a.m_bUseDiffuseTextureAlphaForObjectTransparencyTexture) - ((int)b.m_bUseDiffuseTextureAlphaForObjectTransparencyTexture);


  return rc;
}